

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

btVector3 __thiscall btConvexHullInternal::getCoordinates(btConvexHullInternal *this,Vertex *v)

{
  btScalar *pbVar1;
  long in_RDI;
  btScalar bVar2;
  btScalar bVar3;
  btVector3 bVar4;
  btVector3 p;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  btVector3 *this_00;
  btVector3 local_30 [3];
  
  this_00 = local_30;
  btVector3::btVector3(this_00);
  bVar2 = Vertex::xvalue((Vertex *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pbVar1 = btVector3::operator_cast_to_float_(this_00);
  pbVar1[*(int *)(in_RDI + 0xa8)] = bVar2;
  bVar3 = Vertex::yvalue((Vertex *)CONCAT44(bVar2,in_stack_ffffffffffffffa0));
  pbVar1 = btVector3::operator_cast_to_float_(this_00);
  pbVar1[*(int *)(in_RDI + 0xac)] = bVar3;
  bVar2 = Vertex::zvalue((Vertex *)CONCAT44(bVar2,in_stack_ffffffffffffffa0));
  pbVar1 = btVector3::operator_cast_to_float_(this_00);
  pbVar1[*(int *)(in_RDI + 0xa4)] = bVar2;
  ::operator*(this_00,(btVector3 *)CONCAT44(bVar2,bVar3));
  bVar4 = operator+(this_00,(btVector3 *)CONCAT44(bVar2,bVar3));
  return (btVector3)bVar4.m_floats;
}

Assistant:

btVector3 btConvexHullInternal::getCoordinates(const Vertex* v)
{
	btVector3 p;
	p[medAxis] = v->xvalue();
	p[maxAxis] = v->yvalue();
	p[minAxis] = v->zvalue();
	return p * scaling + center;
}